

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start,bool type)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  undefined1 in_R8B;
  bool bVar3;
  int mid;
  int hi;
  int lo;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  pivotkey;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff18;
  ushort in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff22;
  undefined1 in_stack_ffffffffffffff23;
  undefined1 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined4 local_d0;
  undefined4 local_cc;
  int in_stack_ffffffffffffff7c;
  IdxCompare *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffffdb;
  int in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffffff0;
  int iVar6;
  
  uVar4 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if (in_ECX + 1 < in_ESI) {
    local_d0 = in_ESI + -1;
    while (uVar4 = uVar4 & 0x1ffffff, 0x18 < local_d0 - in_ECX) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero(in_stack_ffffffffffffff18);
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero(in_stack_ffffffffffffff18);
      iVar1 = in_ECX + (local_d0 - in_ECX) / 2;
      local_cc = in_ECX;
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,
                                       CONCAT15(in_stack_ffffffffffffff25,
                                                CONCAT14(in_stack_ffffffffffffff24,
                                                         CONCAT13(in_stack_ffffffffffffff23,
                                                                  CONCAT12(in_stack_ffffffffffffff22
                                                                           ,
                                                  in_stack_ffffffffffffff20)))))),
                  in_stack_ffffffffffffff18);
      iVar5 = local_cc;
      iVar6 = local_d0;
      while( true ) {
        if ((uVar4 & 0x1000000) == 0) {
          while( true ) {
            bVar3 = false;
            if (local_cc < iVar6) {
              iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::IdxCompare::operator()
                                ((IdxCompare *)CONCAT44(iVar1,in_ECX),
                                 (Element *)
                                 CONCAT17(in_stack_ffffffffffffff27,
                                          CONCAT16(in_stack_ffffffffffffff26,
                                                   (uint6)CONCAT14(in_stack_ffffffffffffff24,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff23,
                                                  CONCAT12(in_stack_ffffffffffffff22,
                                                           in_stack_ffffffffffffff20))))),
                                 in_stack_ffffffffffffff18);
              bVar3 = iVar2 < 1;
            }
            if (!bVar3) break;
            local_cc = local_cc + 1;
          }
          in_stack_ffffffffffffff25 = 0;
          while( true ) {
            bVar3 = false;
            if (iVar5 < local_d0) {
              iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::IdxCompare::operator()
                                ((IdxCompare *)CONCAT44(iVar1,in_ECX),
                                 (Element *)
                                 CONCAT17(in_stack_ffffffffffffff27,
                                          CONCAT16(in_stack_ffffffffffffff26,
                                                   CONCAT15(in_stack_ffffffffffffff25,
                                                            (uint5)CONCAT13(
                                                  in_stack_ffffffffffffff23,
                                                  CONCAT12(in_stack_ffffffffffffff22,
                                                           in_stack_ffffffffffffff20))))),
                                 in_stack_ffffffffffffff18);
              bVar3 = 0 < iVar2;
            }
            if (!bVar3) break;
            local_d0 = local_d0 + -1;
          }
          in_stack_ffffffffffffff24 = 0;
        }
        else {
          while( true ) {
            bVar3 = false;
            if (local_cc < iVar6) {
              iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::IdxCompare::operator()
                                ((IdxCompare *)CONCAT44(iVar1,in_ECX),
                                 (Element *)
                                 (ulong)CONCAT16(in_stack_ffffffffffffff26,
                                                 CONCAT15(in_stack_ffffffffffffff25,
                                                          CONCAT14(in_stack_ffffffffffffff24,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff23,
                                                  CONCAT12(in_stack_ffffffffffffff22,
                                                           in_stack_ffffffffffffff20))))),
                                 in_stack_ffffffffffffff18);
              bVar3 = iVar2 < 0;
            }
            if (!bVar3) break;
            local_cc = local_cc + 1;
          }
          in_stack_ffffffffffffff27 = 0;
          while( true ) {
            bVar3 = false;
            if (iVar5 < local_d0) {
              iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::IdxCompare::operator()
                                ((IdxCompare *)CONCAT44(iVar1,in_ECX),
                                 (Element *)
                                 CONCAT17(in_stack_ffffffffffffff27,
                                          (uint7)CONCAT15(in_stack_ffffffffffffff25,
                                                          CONCAT14(in_stack_ffffffffffffff24,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff23,
                                                  CONCAT12(in_stack_ffffffffffffff22,
                                                           in_stack_ffffffffffffff20))))),
                                 in_stack_ffffffffffffff18);
              bVar3 = -1 < iVar2;
            }
            if (!bVar3) break;
            local_d0 = local_d0 + -1;
          }
          in_stack_ffffffffffffff26 = 0;
        }
        if (local_d0 <= local_cc) break;
        Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  CONCAT14(in_stack_ffffffffffffff24,
                                                           CONCAT13(in_stack_ffffffffffffff23,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20)))))),
                    in_stack_ffffffffffffff18);
        Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  CONCAT14(in_stack_ffffffffffffff24,
                                                           CONCAT13(in_stack_ffffffffffffff23,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20)))))),
                    in_stack_ffffffffffffff18);
        Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  CONCAT14(in_stack_ffffffffffffff24,
                                                           CONCAT13(in_stack_ffffffffffffff23,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20)))))),
                    in_stack_ffffffffffffff18);
        local_cc = local_cc + 1;
        local_d0 = local_d0 + -1;
      }
      if ((uVar4 & 0x1000000) == 0) {
        while( true ) {
          in_stack_ffffffffffffff22 = false;
          if (iVar5 < local_d0) {
            iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::IdxCompare::operator()
                              ((IdxCompare *)CONCAT44(iVar1,in_ECX),
                               (Element *)
                               CONCAT17(in_stack_ffffffffffffff27,
                                        CONCAT16(in_stack_ffffffffffffff26,
                                                 CONCAT15(in_stack_ffffffffffffff25,
                                                          CONCAT14(in_stack_ffffffffffffff24,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff23,
                                                  (uint3)in_stack_ffffffffffffff20))))),
                               in_stack_ffffffffffffff18);
            in_stack_ffffffffffffff22 = iVar2 < 1;
          }
          if ((bool)in_stack_ffffffffffffff22 == false) break;
          local_d0 = local_d0 + -1;
        }
        if (local_d0 == iVar6) {
          Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,
                                           CONCAT15(in_stack_ffffffffffffff25,
                                                    CONCAT14(in_stack_ffffffffffffff24,
                                                             CONCAT13(in_stack_ffffffffffffff23,
                                                                      (uint3)
                                                  in_stack_ffffffffffffff20))))),
                      in_stack_ffffffffffffff18);
          Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,
                                           CONCAT15(in_stack_ffffffffffffff25,
                                                    CONCAT14(in_stack_ffffffffffffff24,
                                                             CONCAT13(in_stack_ffffffffffffff23,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20)))))),
                      in_stack_ffffffffffffff18);
          Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,
                                           CONCAT15(in_stack_ffffffffffffff25,
                                                    CONCAT14(in_stack_ffffffffffffff24,
                                                             CONCAT13(in_stack_ffffffffffffff23,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20)))))),
                      in_stack_ffffffffffffff18);
          local_d0 = local_d0 + -1;
        }
      }
      else {
        while( true ) {
          in_stack_ffffffffffffff23 = false;
          if (local_cc < iVar6) {
            iVar2 = SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::IdxCompare::operator()
                              ((IdxCompare *)CONCAT44(iVar1,in_ECX),
                               (Element *)
                               CONCAT17(in_stack_ffffffffffffff27,
                                        CONCAT16(in_stack_ffffffffffffff26,
                                                 CONCAT15(in_stack_ffffffffffffff25,
                                                          CONCAT14(in_stack_ffffffffffffff24,
                                                                   (uint)CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20))))),
                               in_stack_ffffffffffffff18);
            in_stack_ffffffffffffff23 = -1 < iVar2;
          }
          if ((bool)in_stack_ffffffffffffff23 == false) break;
          local_cc = local_cc + 1;
        }
        if (local_cc == iVar5) {
          Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,
                                           CONCAT15(in_stack_ffffffffffffff25,
                                                    CONCAT14(in_stack_ffffffffffffff24,
                                                             (uint)CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20))))),
                      in_stack_ffffffffffffff18);
          Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,
                                           CONCAT15(in_stack_ffffffffffffff25,
                                                    CONCAT14(in_stack_ffffffffffffff24,
                                                             CONCAT13(in_stack_ffffffffffffff23,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20)))))),
                      in_stack_ffffffffffffff18);
          Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator=((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_ffffffffffffff27,
                                  CONCAT16(in_stack_ffffffffffffff26,
                                           CONCAT15(in_stack_ffffffffffffff25,
                                                    CONCAT14(in_stack_ffffffffffffff24,
                                                             CONCAT13(in_stack_ffffffffffffff23,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff22,
                                                  in_stack_ffffffffffffff20)))))),
                      in_stack_ffffffffffffff18);
          local_cc = local_cc + 1;
        }
      }
      iVar1 = (int)((ulong)in_RDX >> 0x20);
      if (iVar6 - local_cc < local_d0 - iVar5) {
        bVar3 = local_cc < iVar6;
        local_cc = iVar5;
        if (bVar3) {
          SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    ((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(iVar6,in_stack_fffffffffffffff0),iVar1,
                     (IdxCompare *)CONCAT44(iVar5,uVar4),in_stack_ffffffffffffffdc,
                     (bool)in_stack_ffffffffffffffdb);
          local_cc = iVar5;
        }
      }
      else {
        bVar3 = iVar5 < local_d0;
        local_d0 = iVar6;
        if (bVar3) {
          SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    ((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(iVar6,in_stack_fffffffffffffff0),iVar1,
                     (IdxCompare *)CONCAT44(iVar5,uVar4),in_stack_ffffffffffffffdc,
                     (bool)in_stack_ffffffffffffffdb);
          local_d0 = iVar6;
        }
      }
      uVar4 = uVar4 ^ 0xff000000;
      in_ECX = local_cc;
    }
    if (0 < local_d0 - in_ECX) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff7c);
    }
  }
  return;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}